

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::PoppifyPass::run(PoppifyPass *this,Module *module)

{
  PassRunner *runner;
  unique_ptr<wasm::(anonymous_namespace)::PoppifyFunctionsPass,_std::default_delete<wasm::(anonymous_namespace)::PoppifyFunctionsPass>_>
  local_118;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_110;
  undefined1 local_108 [8];
  PassRunner subRunner;
  Module *module_local;
  PoppifyPass *this_local;
  
  subRunner._232_8_ = module;
  runner = Pass::getPassRunner(&this->super_Pass);
  PassRunner::PassRunner((PassRunner *)local_108,runner);
  std::make_unique<wasm::(anonymous_namespace)::PoppifyFunctionsPass>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::PoppifyFunctionsPass,std::default_delete<wasm::(anonymous_namespace)::PoppifyFunctionsPass>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_110,&local_118);
  PassRunner::add((PassRunner *)local_108,&local_110);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_110);
  std::
  unique_ptr<wasm::(anonymous_namespace)::PoppifyFunctionsPass,_std::default_delete<wasm::(anonymous_namespace)::PoppifyFunctionsPass>_>
  ::~unique_ptr(&local_118);
  PassRunner::run((PassRunner *)local_108);
  lowerTupleGlobals(this,(Module *)subRunner._232_8_);
  PassRunner::~PassRunner((PassRunner *)local_108);
  return;
}

Assistant:

void run(Module* module) {
    PassRunner subRunner(getPassRunner());
    subRunner.add(std::make_unique<PoppifyFunctionsPass>());
    // TODO: Enable this once it handles Poppy blocks correctly
    // subRunner.add(std::make_unique<ReFinalize>());
    subRunner.run();
    lowerTupleGlobals(module);
  }